

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void av1_pick_filter_restoration(YV12_BUFFER_CONFIG *src,AV1_COMP *cpi)

{
  undefined8 *puVar1;
  uint8_t uVar2;
  _Bool _Var3;
  _Bool _Var4;
  BLOCK_SIZE bsize;
  RestorationType RVar5;
  RefCntBuffer *pRVar6;
  SequenceHeader *pSVar7;
  RestUnitSearchInfo *pRVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  YV12_BUFFER_CONFIG *pYVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  int plane;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  RestorationUnitInfo *pRVar18;
  void *__s;
  int16_t *piVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  RestorationType r_1;
  uint uVar23;
  long lVar24;
  RestorationType r;
  size_t size;
  RestorationInfo *pRVar25;
  undefined **ppuVar26;
  AV1_COMMON *cm;
  int plane_1;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  int luma_unit_size;
  _Bool disable_lr_filter [4];
  int min_unit_size;
  int plane_h_2;
  int plane_h;
  int rrow1;
  int rcol1;
  int plane_h_1;
  int rrow0;
  int rcol0;
  int plane_h_3;
  int plane_w;
  uint local_288;
  char local_274;
  _Bool _Stack_273;
  _Bool _Stack_272;
  undefined1 uStack_271;
  uint local_270;
  int local_26c;
  SequenceHeader *local_268;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  int local_24c;
  ulong local_248;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  uint local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  ulong local_210;
  RestorationType local_208 [4];
  long local_1f8;
  AV1_COMMON *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  ulong local_1c8;
  RestorationInfo *local_1c0;
  RestorationInfo *local_1b8;
  double local_1b0;
  ulong local_1a8;
  ThreadData_conflict *local_1a0;
  YV12_BUFFER_CONFIG *local_198;
  LOOP_FILTER_SPEED_FEATURES *local_190;
  YV12_BUFFER_CONFIG *local_188;
  long local_180;
  long local_178;
  long local_170;
  YV12_BUFFER_CONFIG *local_168;
  YV12_BUFFER_CONFIG *local_160;
  AV1_COMMON *local_158;
  ThreadData_conflict *local_150;
  undefined4 local_148;
  int local_144;
  int local_140;
  RestUnitSearchInfo *local_138;
  LOOP_FILTER_SPEED_FEATURES *local_130;
  uint8_t *local_128;
  undefined4 local_120;
  uint8_t *local_118;
  undefined4 local_110;
  undefined1 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined2 local_a0;
  undefined4 local_9e;
  undefined8 local_98;
  undefined2 local_90;
  undefined4 local_8e;
  undefined8 local_84;
  undefined8 local_78;
  undefined2 local_70;
  undefined4 local_6e;
  undefined8 local_68;
  undefined2 local_60;
  undefined4 local_5e;
  undefined8 local_54;
  int16_t *local_48;
  int16_t *piStack_40;
  
  local_1f0 = &cpi->common;
  local_268 = (cpi->common).seq_params;
  local_190 = &(cpi->sf).lpf_sf;
  uVar2 = local_268->monochrome;
  local_26c = CONCAT31(local_26c._1_3_,uVar2);
  local_248 = (ulong)((uint)(uVar2 == '\0') * 2 + 1);
  local_25c = (uint)local_268->use_highbitdepth;
  local_188 = src;
  av1_fill_lr_rates(&(cpi->td).mb.mode_costs,(cpi->td).mb.e_mbd.tile_ctx);
  uVar23 = (cpi->sf).lpf_sf.min_lr_unit_size;
  local_288 = (cpi->sf).lpf_sf.max_lr_unit_size;
  local_254 = (uint)block_size_wide[((cpi->common).seq_params)->sb_size];
  if ((int)(uint)block_size_wide[((cpi->common).seq_params)->sb_size] < (int)uVar23) {
    local_254 = uVar23;
  }
  uVar27 = 0;
  do {
    av1_get_upsampled_plane_size(local_1f0,(uint)(uVar27 != 0),(int *)&local_168,&local_228);
    uVar23 = local_254;
    iVar14 = av1_lr_count_units(local_254,(int)local_168);
    iVar15 = av1_lr_count_units(uVar23,local_228);
    aom_free((&(cpi->common).rst_info[0].unit_info)[uVar27]);
    size = (long)(iVar15 * iVar14) << 6;
    pRVar18 = (RestorationUnitInfo *)aom_memalign(0x10,size);
    (&(cpi->common).rst_info[0].unit_info)[uVar27] = pRVar18;
    if (pRVar18 == (RestorationUnitInfo *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate rsi->unit_info"
                        );
    }
    __s = aom_memalign(0x10,size);
    if (__s == (void *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate rusi");
    }
    memset(__s,0,size);
    uVar23 = local_25c;
    *(void **)((long)(cpi->pick_lr_ctxt).rusi + uVar27) = __s;
    uVar27 = uVar27 + 8;
  } while ((uint)(uVar2 == '\0') * 0x10 + 8 != uVar27);
  if ((int)local_288 < (int)local_254) {
    local_288 = local_254;
  }
  (cpi->td).mb.rdmult = (cpi->rd).RDMULT;
  local_198 = &cpi->trial_frame_rst;
  iVar14 = aom_realloc_frame_buffer
                     (local_198,(cpi->common).superres_upscaled_width,
                      (cpi->common).superres_upscaled_height,local_268->subsampling_x,
                      local_268->subsampling_y,local_25c,0x20,(cpi->common).features.byte_alignment,
                      (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                      false,0);
  if (iVar14 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");
  }
  local_48 = (int16_t *)0x0;
  piStack_40 = (int16_t *)0x0;
  if (((cpi->sf).lpf_sf.disable_wiener_filter == false) && ((char)uVar23 == '\0')) {
    piVar19 = (int16_t *)aom_memalign(0x20,0xc0000);
    (cpi->pick_lr_ctxt).dgd_avg = piVar19;
    if (piVar19 == (int16_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->pick_lr_ctxt.dgd_avg");
    }
    piVar19 = (cpi->pick_lr_ctxt).dgd_avg;
    local_48 = piVar19;
    memset(piVar19,0,0xc0000);
    piStack_40 = piVar19 + 0x30000;
  }
  cm = local_1f0;
  uVar23 = local_25c;
  lVar20 = local_248 - 1;
  auVar32._8_4_ = (int)lVar20;
  auVar32._0_8_ = lVar20;
  auVar32._12_4_ = (int)((ulong)lVar20 >> 0x20);
  (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
  auVar32 = auVar32 ^ _DAT_004dedf0;
  if (auVar32._12_4_ != -0x80000000 || -0x80000000 < auVar32._8_4_) {
    (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
  }
  if (auVar32._4_4_ != -0x80000000 || -0x7fffffff < auVar32._0_4_) {
    (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
    *(undefined4 *)&(cpi->common).rst_tmpbuf = 0;
  }
  iVar14 = (cpi->sf).lpf_sf.disable_loop_restoration_luma;
  local_268 = (SequenceHeader *)CONCAT44(local_268._4_4_,iVar14);
  uVar17 = 0;
  if ((char)local_26c == '\0') {
    uVar17 = (uint)((cpi->sf).lpf_sf.disable_loop_restoration_chroma == 0) * 2;
  }
  _Var3 = (cpi->sf).lpf_sf.disable_wiener_filter;
  _Var4 = (cpi->sf).lpf_sf.disable_sgr_filter;
  uVar12 = 0;
  if (_Var3 != false) {
    uVar12 = _Var4;
  }
  uVar13 = 1;
  if (_Var3 == false) {
    uVar13 = _Var4;
  }
  _local_274 = CONCAT13(uVar13,CONCAT12(_Var4,CONCAT11(_Var3,uVar12)));
  local_258 = (uint)(iVar14 != 0);
  local_270 = uVar17;
  if ((iVar14 != 0) <= uVar17) {
    uVar27 = (ulong)(iVar14 != 0);
    do {
      pRVar6 = (cpi->common).cur_frame;
      av1_get_upsampled_plane_size(cm,(uint)(uVar27 != 0),&local_228,(int *)local_208);
      av1_extend_frame((pRVar6->buf).store_buf_adr[uVar27 - 4],local_228,local_208[0],
                       *(int *)((long)(pRVar6->buf).store_buf_adr + (ulong)(uVar27 != 0) * 4 + -0x28
                               ),3,3,uVar23);
      uVar27 = uVar27 + 1;
    } while ((ulong)uVar17 + 1 != uVar27);
  }
  local_1a0 = &cpi->td;
  local_1c8 = (ulong)((int)local_268 != 0);
  pRVar25 = (cpi->common).rst_info;
  uVar27 = (ulong)(local_270 | 1);
  dVar30 = 1.79769313486232e+308;
  local_250 = local_288;
  local_1c0 = pRVar25;
  local_1a8 = uVar27;
  uVar28 = local_248;
  uVar23 = local_258;
  do {
    local_208[2] = 0;
    local_208[0] = RESTORE_NONE;
    local_208[1] = RESTORE_NONE;
    local_1b0 = dVar30;
    if (local_270 < uVar23) {
      dVar30 = 0.0;
      lVar20 = 0;
    }
    else {
      lVar20 = 0;
      lVar24 = 0;
      uVar28 = local_1c8;
      do {
        local_1b8 = pRVar25 + uVar28;
        uVar23 = (uint)(uVar28 != 0);
        local_210 = uVar28;
        local_180 = lVar24;
        local_178 = lVar20;
        set_restoration_unit_size(cm,local_1b8,uVar23,local_288);
        pYVar11 = local_188;
        local_138 = (cpi->pick_lr_ctxt).rusi[uVar28];
        local_168 = local_188;
        local_160 = local_198;
        local_150 = local_1a0;
        local_148 = (undefined4)local_210;
        local_130 = local_190;
        pRVar6 = (cpi->common).cur_frame;
        local_158 = cm;
        av1_get_upsampled_plane_size(cm,uVar23,&local_228,&local_24c);
        pRVar25 = local_1c0;
        uVar21 = local_210;
        uVar27 = (ulong)((uint)(uVar28 != 0) * 4);
        local_144 = local_228;
        local_140 = local_24c;
        local_118 = pYVar11->store_buf_adr[local_210 - 4];
        local_110 = *(undefined4 *)((long)pYVar11->store_buf_adr + (uVar27 - 0x28));
        local_128 = (pRVar6->buf).store_buf_adr[local_210 - 4];
        local_120 = *(undefined4 *)((long)(pRVar6->buf).store_buf_adr + (uVar27 - 0x28));
        pSVar7 = (cpi->common).seq_params;
        bVar29 = false;
        if (local_210 != 0) {
          bVar29 = pSVar7->subsampling_y != 0;
        }
        bsize = pSVar7->sb_size;
        local_234 = pSVar7->mib_size_log2;
        local_268 = (SequenceHeader *)(ulong)(uint)local_1c0[uVar28].restoration_unit_size;
        av1_get_upsampled_plane_size(cm,uVar23,&local_24c,&local_1cc);
        iVar14 = pRVar25[uVar28].num_rest_units;
        local_b8 = (undefined1  [16])0x0;
        local_c8 = (undefined1  [16])0x0;
        local_d8 = (undefined1  [16])0x0;
        local_e8 = (undefined1  [16])0x0;
        if (0 < (cpi->common).tiles.rows) {
          local_26c = ((int)local_268 * 3) / 2;
          local_22c = 8 >> bVar29;
          local_1f8 = 0;
          do {
            if (0 < (cpi->common).tiles.cols) {
              local_23c = (cpi->common).tiles.row_start_sb[local_1f8];
              local_238 = (cpi->common).tiles.row_start_sb[local_1f8 + 1];
              lVar20 = 0;
              do {
                local_1e4 = (cpi->common).tiles.col_start_sb[lVar20];
                local_170 = lVar20;
                local_230 = (cpi->common).tiles.col_start_sb[lVar20 + 1];
                local_98 = 0xffea000ffff90003;
                local_a8 = 0xffea000ffff90003;
                local_90 = 0xf;
                local_a0 = 0xf;
                local_8e = 0x3fff9;
                local_9e = 0x3fff9;
                local_84 = 0x1fffffffe0;
                local_68 = 0xffea000ffff90003;
                local_78 = 0xffea000ffff90003;
                local_60 = 0xf;
                local_70 = 0xf;
                local_5e = 0x3fff9;
                local_6e = 0x3fff9;
                local_54 = 0x1fffffffe0;
                iVar15 = local_23c;
                if (local_23c < local_238) {
                  do {
                    local_1e0 = iVar15;
                    local_1dc = iVar15 << ((byte)local_234 & 0x1f);
                    iVar15 = local_1e4;
                    if (local_1e4 < local_230) {
                      do {
                        iVar16 = av1_loop_restoration_corners_in_sb
                                           (cm,(int)uVar21,local_1dc,
                                            iVar15 << ((byte)local_234 & 0x1f),bsize,&local_1d0,
                                            &local_214,&local_1d4,&local_218);
                        if (iVar16 != 0) {
                          local_1d8 = iVar15;
                          for (iVar16 = local_1d4; uVar21 = local_210, cm = local_1f0,
                              iVar15 = local_1d8, iVar16 < local_218; iVar16 = iVar16 + 1) {
                            local_220 = iVar16 * (int)local_268;
                            local_21c = local_1cc - local_220;
                            if (local_26c <= local_1cc - local_220) {
                              local_21c = (int)local_268;
                            }
                            local_21c = local_21c + local_220;
                            local_220 = local_220 - local_22c;
                            if (local_220 < 1) {
                              local_220 = 0;
                            }
                            if (local_21c < local_1cc) {
                              local_21c = local_21c - local_22c;
                            }
                            iVar15 = local_1d0;
                            if (local_1d0 < local_214) {
                              do {
                                local_228 = iVar15 * (int)local_268;
                                iVar22 = local_24c - local_228;
                                if (local_26c <= local_24c - local_228) {
                                  iVar22 = (int)local_268;
                                }
                                local_224 = iVar22 + local_228;
                                iVar22 = local_1b8->horz_units;
                                local_f0 = 0;
                                ppuVar26 = &restoration_search_funs;
                                lVar20 = 0;
                                do {
                                  if ((&local_274)[lVar20] == '\0') {
                                    (*(code *)*ppuVar26)
                                              (&local_228,iVar22 * iVar16 + iVar15,&local_168,
                                               local_158->rst_tmpbuf,0,(cpi->common).error);
                                  }
                                  lVar20 = lVar20 + 1;
                                  ppuVar26 = ppuVar26 + 1;
                                } while ((ulong)(1 < iVar14) + 3 != lVar20);
                                iVar15 = iVar15 + 1;
                              } while (iVar15 < local_214);
                            }
                          }
                        }
                        iVar15 = iVar15 + 1;
                      } while (iVar15 != local_230);
                    }
                    iVar15 = local_1e0 + 1;
                  } while (local_1e0 + 1 != local_238);
                }
                lVar20 = local_170 + 1;
              } while (lVar20 < (cpi->common).tiles.cols);
            }
            local_1f8 = local_1f8 + 1;
          } while (local_1f8 < (cpi->common).tiles.rows);
        }
        lVar20 = local_178;
        uVar27 = local_1a8;
        iVar14 = local_1b8->num_rest_units;
        lVar24 = 0;
        dVar30 = 1.79769313486232e+308;
        do {
          if (((&local_274)[lVar24] == '\0') &&
             (dVar31 = (double)(*(long *)(local_e8 + lVar24 * 8) >>
                               ((char)((cpi->common).seq_params)->bit_depth * '\x02' - 0x10U & 0x3f)
                               ) * 128.0 +
                       (double)(cpi->td).mb.rdmult * (double)(*(long *)(local_c8 + lVar24 * 8) >> 4)
                       * 0.001953125, dVar31 < dVar30)) {
            local_208[uVar21] = (RestorationType)lVar24;
            dVar30 = dVar31;
          }
          lVar24 = lVar24 + 1;
        } while ((ulong)(1 < iVar14) + 3 != lVar24);
        lVar24 = local_180 + *(long *)(local_c8 + (ulong)local_208[uVar21] * 8);
        lVar20 = lVar20 + *(long *)(local_e8 + (ulong)local_208[uVar21] * 8);
        uVar28 = uVar21 + 1;
        pRVar25 = local_1c0;
      } while (uVar28 != uVar27);
      dVar30 = (double)(lVar24 >> 4);
      uVar28 = local_248;
      uVar23 = local_258;
    }
    dVar31 = (double)(lVar20 >>
                     ((char)((cpi->common).seq_params)->bit_depth * '\x02' - 0x10U & 0x3f)) * 128.0
             + (double)(cpi->td).mb.rdmult * dVar30 * 0.001953125;
    dVar30 = local_1b0;
    if (dVar31 < local_1b0) {
      local_250 = local_288;
      dVar30 = dVar31;
    }
    bVar29 = true;
    uVar17 = local_250;
    if ((dVar31 < local_1b0) && (uVar23 <= local_270)) {
      bVar29 = true;
      uVar21 = local_1c8;
      do {
        RVar5 = local_208[uVar21];
        pRVar25[uVar21].frame_restoration_type = RVar5;
        if (RVar5 != RESTORE_NONE) {
          iVar14 = pRVar25[uVar21].num_rest_units;
          if (0 < (long)iVar14) {
            lVar20 = 0;
            do {
              pRVar8 = (cpi->pick_lr_ctxt).rusi[uVar21];
              puVar1 = (undefined8 *)((long)(pRVar8->wiener).vfilter + lVar20);
              pRVar18 = pRVar25[uVar21].unit_info;
              iVar15 = *(int *)((ulong)(RVar5 - RESTORE_WIENER) * 4 + 0x2c + (long)puVar1);
              *(int *)((long)(pRVar18->wiener_info).vfilter + lVar20 + -0x10) = iVar15;
              if (iVar15 == 1) {
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                *(undefined1 (*) [16])((long)(pRVar18->wiener_info).hfilter + lVar20) =
                     *(undefined1 (*) [16])(puVar1 + 2);
                puVar1 = (undefined8 *)((long)(pRVar18->wiener_info).vfilter + lVar20);
                *puVar1 = uVar9;
                puVar1[1] = uVar10;
              }
              else {
                *(undefined4 *)((long)(pRVar18->sgrproj_info).xqd + lVar20 + 4) =
                     *(undefined4 *)((long)(pRVar8->sgrproj).xqd + lVar20 + 4);
                *(undefined8 *)((long)(pRVar18->sgrproj_info).xqd + lVar20 + -4) =
                     *(undefined8 *)((long)(pRVar8->sgrproj).xqd + lVar20 + -4);
              }
              lVar20 = lVar20 + 0x40;
            } while ((long)iVar14 * 0x40 != lVar20);
          }
          bVar29 = false;
        }
        uVar21 = uVar21 + 1;
        uVar28 = local_248;
        uVar17 = local_288;
        dVar30 = dVar31;
        uVar23 = local_258;
      } while (uVar21 != uVar27);
    }
    local_250 = uVar17;
  } while ((!bVar29) && (local_288 = local_288 >> 1, local_254 <= local_288));
  uVar27 = 0;
  do {
    set_restoration_unit_size
              (cm,(RestorationInfo *)((long)&pRVar25->frame_restoration_type + uVar27),
               (uint)(uVar27 != 0),uVar17);
    uVar27 = uVar27 + 0x40;
  } while ((uint)((int)uVar28 << 6) != uVar27);
  if (((cpi->sf).lpf_sf.disable_wiener_filter == false) && ((char)local_25c == '\0')) {
    aom_free((cpi->pick_lr_ctxt).dgd_avg);
    (cpi->pick_lr_ctxt).dgd_avg = (int16_t *)0x0;
  }
  uVar27 = local_248;
  uVar28 = 0;
  do {
    aom_free((cpi->pick_lr_ctxt).rusi[uVar28]);
    (cpi->pick_lr_ctxt).rusi[uVar28] = (RestUnitSearchInfo *)0x0;
    uVar28 = uVar28 + 1;
  } while (uVar27 != uVar28);
  return;
}

Assistant:

void av1_pick_filter_restoration(const YV12_BUFFER_CONFIG *src, AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &cpi->td.mb;
  const SequenceHeader *const seq_params = cm->seq_params;
  const LOOP_FILTER_SPEED_FEATURES *lpf_sf = &cpi->sf.lpf_sf;
  const int num_planes = av1_num_planes(cm);
  const int highbd = cm->seq_params->use_highbitdepth;
  assert(!cm->features.all_lossless);

  av1_fill_lr_rates(&x->mode_costs, x->e_mbd.tile_ctx);

  // Select unit size based on speed feature settings, and allocate
  // rui structs based on this size
  int min_lr_unit_size = cpi->sf.lpf_sf.min_lr_unit_size;
  int max_lr_unit_size = cpi->sf.lpf_sf.max_lr_unit_size;

  // The minimum allowed unit size at a syntax level is 1 superblock.
  // Apply this constraint here so that the speed features code which sets
  // cpi->sf.lpf_sf.min_lr_unit_size does not need to know the superblock size
  min_lr_unit_size =
      AOMMAX(min_lr_unit_size, block_size_wide[cm->seq_params->sb_size]);

  max_lr_unit_size = AOMMAX(min_lr_unit_size, max_lr_unit_size);

  for (int plane = 0; plane < num_planes; ++plane) {
    cpi->pick_lr_ctxt.rusi[plane] = allocate_search_structs(
        cm, &cm->rst_info[plane], plane > 0, min_lr_unit_size);
  }

  x->rdmult = cpi->rd.RDMULT;

  // Allocate the frame buffer trial_frame_rst, which is used to temporarily
  // store the loop restored frame.
  if (aom_realloc_frame_buffer(
          &cpi->trial_frame_rst, cm->superres_upscaled_width,
          cm->superres_upscaled_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");

  RestSearchCtxt rsc;

  // The buffers 'src_avg' and 'dgd_avg' are used to compute H and M buffers.
  // These buffers are only required for the AVX2 and NEON implementations of
  // av1_compute_stats. The buffer size required is calculated based on maximum
  // width and height of the LRU (i.e., from foreach_rest_unit_in_plane() 1.5
  // times the RESTORATION_UNITSIZE_MAX) allowed for Wiener filtering. The width
  // and height aligned to multiple of 16 is considered for intrinsic purpose.
  rsc.dgd_avg = NULL;
  rsc.src_avg = NULL;
#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
  // The buffers allocated below are used during Wiener filter processing.
  // Hence, allocate the same when Wiener filter is enabled. Make sure to
  // allocate these buffers only for the SIMD extensions that make use of them
  // (i.e. AVX2 for low bitdepth and NEON and SVE for low and high bitdepth).
#if HAVE_AVX2
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (allocate_buffers) {
    const int buf_size = sizeof(*cpi->pick_lr_ctxt.dgd_avg) * 6 *
                         RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    CHECK_MEM_ERROR(cm, cpi->pick_lr_ctxt.dgd_avg,
                    (int16_t *)aom_memalign(32, buf_size));

    rsc.dgd_avg = cpi->pick_lr_ctxt.dgd_avg;
    // When LRU width isn't multiple of 16, the 256 bits load instruction used
    // in AVX2 intrinsic can read data beyond valid LRU. Hence, in order to
    // silence Valgrind warning this buffer is initialized with zero. Overhead
    // due to this initialization is negligible since it is done at frame level.
    memset(rsc.dgd_avg, 0, buf_size);
    rsc.src_avg =
        rsc.dgd_avg + 3 * RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    // Asserts the starting address of src_avg is always 32-bytes aligned.
    assert(!((intptr_t)rsc.src_avg % 32));
  }
#endif

  // Initialize all planes, so that any planes we skip searching will still have
  // valid data
  for (int plane = 0; plane < num_planes; plane++) {
    cm->rst_info[plane].frame_restoration_type = RESTORE_NONE;
  }

  // Decide which planes to search
  int plane_start, plane_end;

  if (lpf_sf->disable_loop_restoration_luma) {
    plane_start = AOM_PLANE_U;
  } else {
    plane_start = AOM_PLANE_Y;
  }

  if (num_planes == 1 || lpf_sf->disable_loop_restoration_chroma) {
    plane_end = AOM_PLANE_Y;
  } else {
    plane_end = AOM_PLANE_V;
  }

  // Derive the flags to enable/disable Loop restoration filters based on the
  // speed features 'disable_wiener_filter' and 'disable_sgr_filter'.
  bool disable_lr_filter[RESTORE_TYPES] = { false };
  av1_derive_flags_for_lr_processing(lpf_sf, disable_lr_filter);

  for (int plane = plane_start; plane <= plane_end; plane++) {
    const YV12_BUFFER_CONFIG *dgd = &cm->cur_frame->buf;
    const int is_uv = plane != AOM_PLANE_Y;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    av1_extend_frame(dgd->buffers[plane], plane_w, plane_h, dgd->strides[is_uv],
                     RESTORATION_BORDER, RESTORATION_BORDER, highbd);
  }

  double best_cost = DBL_MAX;
  int best_luma_unit_size = max_lr_unit_size;
  for (int luma_unit_size = max_lr_unit_size;
       luma_unit_size >= min_lr_unit_size; luma_unit_size >>= 1) {
    int64_t bits_this_size = 0;
    int64_t sse_this_size = 0;
    RestorationType best_rtype[MAX_MB_PLANE] = { RESTORE_NONE, RESTORE_NONE,
                                                 RESTORE_NONE };
    for (int plane = plane_start; plane <= plane_end; ++plane) {
      set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                                luma_unit_size);
      init_rsc(src, &cpi->common, x, lpf_sf, plane,
               cpi->pick_lr_ctxt.rusi[plane], &cpi->trial_frame_rst, &rsc);

      restoration_search(cm, plane, &rsc, disable_lr_filter);

      const int plane_num_units = cm->rst_info[plane].num_rest_units;
      const RestorationType num_rtypes =
          (plane_num_units > 1) ? RESTORE_TYPES : RESTORE_SWITCHABLE_TYPES;
      double best_cost_this_plane = DBL_MAX;
      for (RestorationType r = 0; r < num_rtypes; ++r) {
        // Disable Loop restoration filter based on the flags set using speed
        // feature 'disable_wiener_filter' and 'disable_sgr_filter'.
        if (disable_lr_filter[r]) continue;

        double cost_this_plane = RDCOST_DBL_WITH_NATIVE_BD_DIST(
            x->rdmult, rsc.total_bits[r] >> 4, rsc.total_sse[r],
            cm->seq_params->bit_depth);

        if (cost_this_plane < best_cost_this_plane) {
          best_cost_this_plane = cost_this_plane;
          best_rtype[plane] = r;
        }
      }

      bits_this_size += rsc.total_bits[best_rtype[plane]];
      sse_this_size += rsc.total_sse[best_rtype[plane]];
    }

    double cost_this_size = RDCOST_DBL_WITH_NATIVE_BD_DIST(
        x->rdmult, bits_this_size >> 4, sse_this_size,
        cm->seq_params->bit_depth);

    if (cost_this_size < best_cost) {
      best_cost = cost_this_size;
      best_luma_unit_size = luma_unit_size;
      // Copy parameters out of rusi struct, before we overwrite it at
      // the start of the next iteration
      bool all_none = true;
      for (int plane = plane_start; plane <= plane_end; ++plane) {
        cm->rst_info[plane].frame_restoration_type = best_rtype[plane];
        if (best_rtype[plane] != RESTORE_NONE) {
          all_none = false;
          const int plane_num_units = cm->rst_info[plane].num_rest_units;
          for (int u = 0; u < plane_num_units; ++u) {
            copy_unit_info(best_rtype[plane], &cpi->pick_lr_ctxt.rusi[plane][u],
                           &cm->rst_info[plane].unit_info[u]);
          }
        }
      }
      // Heuristic: If all best_rtype entries are RESTORE_NONE, this means we
      // couldn't find any good filters at this size. So we likely won't find
      // any good filters at a smaller size either, so skip
      if (all_none) {
        break;
      }
    } else {
      // Heuristic: If this size is worse than the previous (larger) size, then
      // the next size down will likely be even worse, so skip
      break;
    }
  }

  // Final fixup to set the correct unit size
  // We set this for all planes, even ones we have skipped searching,
  // so that other code does not need to care which planes were and weren't
  // searched
  for (int plane = 0; plane < num_planes; ++plane) {
    set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                              best_luma_unit_size);
  }

#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
#if HAVE_AVX2
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (free_buffers) {
    aom_free(cpi->pick_lr_ctxt.dgd_avg);
    cpi->pick_lr_ctxt.dgd_avg = NULL;
  }
#endif
  for (int plane = 0; plane < num_planes; plane++) {
    aom_free(cpi->pick_lr_ctxt.rusi[plane]);
    cpi->pick_lr_ctxt.rusi[plane] = NULL;
  }
}